

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Synth::tick(V2Synth *this)

{
  int i_1;
  int chan;
  V2Voice *this_00;
  int i;
  long lVar1;
  
  this_00 = this->voicesw;
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 1) {
    if (-1 < this->chanmap[lVar1]) {
      storeV2Values(this,(int)lVar1);
      V2Voice::tick(this_00);
      if (this_00->env[0].state == OFF) {
        this->chanmap[lVar1] = -1;
      }
    }
    this_00 = this_00 + 1;
  }
  for (chan = 0; chan != 0x10; chan = chan + 1) {
    storeChanValues(this,chan);
  }
  ronanCBTick((syWRonan *)&this->ronan);
  this->tickd = (this->instance).SRcFrameSize;
  renderFrame(this);
  return;
}

Assistant:

void tick()
    {
        // voices
        for (int i = 0; i < POLY; i++)
        {
            if (chanmap[i] < 0)
                continue;

            storeV2Values(i);
            voicesw[i].tick();

            // if EG1 finished, turn off voice
            if (voicesw[i].env[0].state == V2Env::OFF)
                chanmap[i] = -1;
        }

        // chans
        for (int i = 0; i < CHANS; i++)
            storeChanValues(i);

        ronanCBTick(&ronan);
        tickd = instance.SRcFrameSize;
        renderFrame();

#if COVERAGE
        // print coverage updates as they happen
        static int cur_frame;
        static const char *old_coverage[COUNTOF(code_coverage)];
        int ccount = synthGetNumCoverage();
        for (int i = 0; i < ccount; i++)
        {
            if (old_coverage[i] != code_coverage[i])
            {
                old_coverage[i] = code_coverage[i];
                printf("[%5d,%3d] %s\n", cur_frame, i, code_coverage[i]);
            }
        }
        cur_frame++;
#endif
    }